

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void MultiplicationHelper<long_long,_long_long,_11>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *t,longlong *u,longlong *ret)

{
  int64_t tmp;
  int64_t u1;
  int64_t t1;
  int64_t local_28;
  longlong local_20;
  longlong local_18;
  
  local_18 = *t;
  local_20 = *u;
  local_28 = 0;
  LargeIntRegMultiply<long,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_18,&local_20,&local_28);
  *ret = local_28;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow( const T& t, const U& u, T& ret ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64 && safeint_internal::int_traits<U>::isInt64, "T, U must be Int64");
        std::int64_t t1 = t;
        std::int64_t u1 = u;
        std::int64_t tmp = 0;
        LargeIntRegMultiply< std::int64_t, std::int64_t >::template RegMultiplyThrow< E >( t1, u1, &tmp);
        ret = tmp;
    }